

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

void __thiscall crnlib::ranctx::seed(ranctx *this,uint32 seed)

{
  uint32 in_ESI;
  ranctx *in_RDI;
  uint32 i;
  uint local_10;
  
  in_RDI->a = 0xf1ea5eed;
  in_RDI->d = in_ESI;
  in_RDI->c = in_ESI;
  in_RDI->b = in_ESI;
  for (local_10 = 0; local_10 < 0x14; local_10 = local_10 + 1) {
    next(in_RDI);
  }
  return;
}

Assistant:

void ranctx::seed(uint32 seed) {
  a = 0xf1ea5eed, b = c = d = seed;
  for (uint32 i = 0; i < 20; ++i)
    next();
}